

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce.h
# Opt level: O0

void __thiscall AllReduceSockets::~AllReduceSockets(AllReduceSockets *this)

{
  AllReduceSockets *in_RDI;
  
  ~AllReduceSockets(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~AllReduceSockets() {}